

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O0

ssize_t __thiscall Button::read(Button *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  uint8_t *puVar3;
  ssize_t sVar4;
  size_t __nbytes_00;
  size_t __nbytes_01;
  size_t __nbytes_02;
  size_t __nbytes_03;
  size_t __nbytes_04;
  void *__buf_00;
  undefined4 in_register_00000034;
  uint8_t *buf_local;
  Button *this_local;
  
  iVar1 = Util::readBool((uint8_t *)CONCAT44(in_register_00000034,__fd),&this->isTextButton);
  puVar3 = (uint8_t *)CONCAT44(in_register_00000034,__fd) + iVar1;
  iVar1 = Util::readBool(puVar3,&this->isCustomBackground);
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readString(puVar3,&this->text);
  puVar3 = puVar3 + iVar1;
  sVar4 = Color::read((int)puVar3,&this->textColor,__nbytes_00);
  puVar3 = puVar3 + (int)sVar4;
  sVar4 = FontData::read((int)puVar3,&this->textFont,__nbytes_01);
  puVar3 = puVar3 + (int)sVar4;
  iVar1 = Util::readInt32(puVar3,&this->textTrimming);
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readBool(puVar3,&this->hasTextShadow);
  puVar3 = puVar3 + iVar1;
  sVar4 = TextShadow::read((int)puVar3,&this->textShadow,__nbytes_02);
  puVar3 = puVar3 + (int)sVar4;
  sVar4 = NinePatchMargin::read((int)puVar3,&this->margin,__nbytes_03);
  puVar3 = puVar3 + (int)sVar4;
  iVar1 = Util::readString(puVar3,&this->backgroundNormalImage);
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readString(puVar3,&this->backgroundPressedImage);
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readString(puVar3,&this->backgroundDisabledImage);
  iVar2 = Util::readString(puVar3 + iVar1,&this->iconImage);
  iVar2 = (int)(puVar3 + iVar1) + iVar2;
  sVar4 = Color::read(iVar2,&this->backgroundFilter,__nbytes_04);
  sVar4 = Widget::read(&this->super_Widget,iVar2 + (int)sVar4,__buf_00,(long)(int)sVar4);
  return sVar4;
}

Assistant:

uint8_t* Button::read(uint8_t* buf)
{
	buf += Util::readBool(buf, isTextButton);
	buf += Util::readBool(buf, isCustomBackground);
	buf += Util::readString(buf, text);
	
	buf += Color::read(buf, textColor);
	buf += FontData::read(buf, textFont);
	buf += Util::readInt32(buf, textTrimming);
	buf += Util::readBool(buf, hasTextShadow);
	buf += TextShadow::read(buf, textShadow);
	buf += NinePatchMargin::read(buf, margin);
	
	buf += Util::readString(buf, backgroundNormalImage);
	buf += Util::readString(buf, backgroundPressedImage);
	buf += Util::readString(buf, backgroundDisabledImage);

	buf += Util::readString(buf, iconImage);

	buf += Color::read(buf, backgroundFilter);
	buf = Widget::read(buf);

	return buf;
}